

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O2

int CTcSymPropBase::load_from_obj_file(CVmFile *fp,textchar_t *fname,tctarg_prop_id_t *prop_xlat)

{
  tctarg_prop_id_t prop;
  char *__s;
  size_t len;
  ulong uVar1;
  CTcSymProp *this;
  char *siz;
  
  __s = CTcSymbolBase::base_read_from_sym_file(fp);
  if (__s == (char *)0x0) {
    return 1;
  }
  len = strlen(__s);
  uVar1 = CVmFile::read_uint4(fp);
  siz = __s;
  this = (CTcSymProp *)CTcPrsSymtab::find(G_prs->global_symtab_,__s,len);
  if (this == (CTcSymProp *)0x0) {
    this = (CTcSymProp *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)siz);
    prop = G_cg->next_prop_;
    G_cg->next_prop_ = prop + 1;
    CTcSymProp::CTcSymProp(this,__s,len,0,prop);
    (*G_prs->global_symtab_->_vptr_CTcPrsSymtab[3])(G_prs->global_symtab_,this);
  }
  else if (*(int *)&((CVmHashEntry *)
                    &(this->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->field_0x24
           != 3) {
    CTcSymbolBase::log_objfile_conflict((CTcSymbolBase *)this,fname,TC_SYM_PROP);
    return 0;
  }
  prop_xlat[uVar1] = (this->super_CTcSymPropBase).prop_;
  return 0;
}

Assistant:

int CTcSymPropBase::load_from_obj_file(class CVmFile *fp,
                                       const textchar_t *fname,
                                       tctarg_prop_id_t *prop_xlat)
{
    /* read the symbol name information */
    const char *txt;
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 1;
    size_t len = strlen(txt);

    /* read our property ID */
    ulong id = fp->read_uint4();

    /* 
     *   If this symbol is already defined, make sure the original
     *   definition is a property.  If it's not defined, define it anew.  
     */
    CTcSymProp *sym = (CTcSymProp *)G_prs->get_global_symtab()->find(txt, len);
    if (sym == 0)
    {
        /* 
         *   It's not defined yet - create the new definition and add it
         *   to the symbol table.  Allocate a new property ID for the
         *   symbol in the normal fashion.  
         */
        sym = new CTcSymProp(txt, len, FALSE, G_cg->new_prop_id());
        G_prs->get_global_symtab()->add_entry(sym);
    }
    else if (sym->get_type() != TC_SYM_PROP)
    {
        /* 
         *   It's not already defined as a property - log a symbol type
         *   conflict error 
         */
        sym->log_objfile_conflict(fname, TC_SYM_PROP);

        /* 
         *   proceed despite the error, since this is merely a symbol
         *   conflict and not a file corruption 
         */
        return 0;
    }

    /*
     *   Set the translation table entry for the symbol.  We know the
     *   original ID local to the object file, and we know the new global
     *   property ID.
     */
    prop_xlat[id] = sym->get_prop();

    /* success */
    return 0;
}